

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O1

void __thiscall
ipx::Model::DualizeBackBasicSolution
          (Model *this,Vector *x_solver,Vector *y_solver,Vector *z_solver,Vector *x_user,
          Vector *slack_user,Vector *y_user,Vector *z_user)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  int *piVar4;
  double *pdVar5;
  double *pdVar6;
  int *piVar7;
  long lVar8;
  size_t sVar9;
  long lVar10;
  
  iVar1 = this->num_cols_;
  if (this->dualized_ == true) {
    sVar3 = x_user->_M_size;
    if (sVar3 == y_solver->_M_size) {
      if (sVar3 != 0) {
        pdVar5 = x_user->_M_data;
        pdVar6 = y_solver->_M_data;
        sVar9 = 0;
        do {
          pdVar5[sVar9] = -pdVar6[sVar9];
          sVar9 = sVar9 + 1;
        } while (sVar3 != sVar9);
      }
    }
    else {
      if (x_user->_M_data != (double *)0x0) {
        operator_delete(x_user->_M_data);
      }
      sVar3 = y_solver->_M_size;
      x_user->_M_size = sVar3;
      pdVar5 = (double *)operator_new(sVar3 << 3);
      x_user->_M_data = pdVar5;
      sVar3 = x_user->_M_size;
      if (sVar3 != 0) {
        pdVar6 = y_solver->_M_data;
        sVar9 = 0;
        do {
          pdVar5[sVar9] = -pdVar6[sVar9];
          sVar9 = sVar9 + 1;
        } while (sVar3 != sVar9);
      }
    }
    iVar2 = this->num_constr_;
    lVar8 = (long)iVar2;
    if (0 < lVar8) {
      pdVar5 = z_solver->_M_data;
      pdVar6 = slack_user->_M_data;
      lVar10 = 0;
      do {
        pdVar6[lVar10] = -pdVar5[lVar10];
        lVar10 = lVar10 + 1;
      } while (lVar8 != lVar10);
    }
    if (0 < iVar2) {
      pdVar5 = (double *)y_user->_M_size;
      if (pdVar5 != (double *)0x0) {
        pdVar5 = y_user->_M_data;
      }
      pdVar6 = (double *)x_solver->_M_size;
      if (pdVar6 != (double *)0x0) {
        pdVar6 = x_solver->_M_data;
      }
      memmove(pdVar5,pdVar6,lVar8 << 3);
    }
    if (0 < (long)this->num_var_) {
      pdVar5 = (double *)z_user->_M_size;
      if (pdVar5 != (double *)0x0) {
        pdVar5 = z_user->_M_data;
      }
      pdVar6 = (double *)x_solver->_M_size;
      if (pdVar6 != (double *)0x0) {
        pdVar6 = x_solver->_M_data;
      }
      memmove(pdVar5,pdVar6 + iVar1,(long)this->num_var_ << 3);
    }
    piVar7 = (this->boxed_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (this->boxed_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (piVar7 != piVar4) {
      pdVar5 = z_user->_M_data;
      pdVar6 = x_solver->_M_data + this->num_constr_;
      do {
        pdVar5[*piVar7] = pdVar5[*piVar7] - *pdVar6;
        piVar7 = piVar7 + 1;
        pdVar6 = pdVar6 + 1;
      } while (piVar7 != piVar4);
    }
  }
  else {
    if (0 < (long)this->num_var_) {
      pdVar5 = (double *)x_user->_M_size;
      if (pdVar5 != (double *)0x0) {
        pdVar5 = x_user->_M_data;
      }
      pdVar6 = (double *)x_solver->_M_size;
      if (pdVar6 != (double *)0x0) {
        pdVar6 = x_solver->_M_data;
      }
      memmove(pdVar5,pdVar6,(long)this->num_var_ << 3);
    }
    if (0 < (long)this->num_constr_) {
      pdVar5 = (double *)slack_user->_M_size;
      if (pdVar5 != (double *)0x0) {
        pdVar5 = slack_user->_M_data;
      }
      pdVar6 = (double *)x_solver->_M_size;
      if (pdVar6 != (double *)0x0) {
        pdVar6 = x_solver->_M_data;
      }
      memmove(pdVar5,pdVar6 + iVar1,(long)this->num_constr_ << 3);
    }
    if (0 < (long)this->num_constr_) {
      pdVar5 = (double *)y_user->_M_size;
      if (pdVar5 != (double *)0x0) {
        pdVar5 = y_user->_M_data;
      }
      pdVar6 = (double *)y_solver->_M_size;
      if (pdVar6 != (double *)0x0) {
        pdVar6 = y_solver->_M_data;
      }
      memmove(pdVar5,pdVar6,(long)this->num_constr_ << 3);
    }
    if (0 < (long)this->num_var_) {
      pdVar5 = (double *)z_user->_M_size;
      if (pdVar5 != (double *)0x0) {
        pdVar5 = z_user->_M_data;
      }
      pdVar6 = (double *)z_solver->_M_size;
      if (pdVar6 != (double *)0x0) {
        pdVar6 = z_solver->_M_data;
      }
      memmove(pdVar5,pdVar6,(long)this->num_var_ << 3);
      return;
    }
  }
  return;
}

Assistant:

void Model::DualizeBackBasicSolution(const Vector& x_solver,
                                     const Vector& y_solver,
                                     const Vector& z_solver,
                                     Vector& x_user,
                                     Vector& slack_user,
                                     Vector& y_user,
                                     Vector& z_user) const {
    const Int m = rows();
    const Int n = cols();

    if (dualized_) {
        assert(num_var_ == m);
        assert(num_constr_ + (Int)boxed_vars_.size() == n);
        x_user = -y_solver;
        for (Int i = 0; i < num_constr_; i++)
            slack_user[i] = -z_solver[i];
        std::copy_n(std::begin(x_solver), num_constr_, std::begin(y_user));
        std::copy_n(std::begin(x_solver) + n, num_var_, std::begin(z_user));
        Int k = num_constr_;
        for (Int j : boxed_vars_)
            z_user[j] -= x_solver[k++];
        assert(k == n);
    }
    else {
        assert(num_constr_ == m);
        assert(num_var_ == n);
        std::copy_n(std::begin(x_solver), num_var_, std::begin(x_user));
        std::copy_n(std::begin(x_solver) + n, num_constr_,
                    std::begin(slack_user));
        std::copy_n(std::begin(y_solver), num_constr_, std::begin(y_user));
        std::copy_n(std::begin(z_solver), num_var_, std::begin(z_user));
    }
}